

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsignal.cpp
# Opt level: O0

void __thiscall lsignal::slot::disconnect(slot *this)

{
  bool bVar1;
  __shared_ptr_access<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  connection_cleaner *cleaner;
  __normal_iterator<const_lsignal::connection_cleaner_*,_std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>_>
  local_30;
  const_iterator iter;
  vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_> cleaners;
  slot *this_local;
  
  std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::vector
            ((vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_> *)
             &iter,&this->_cleaners);
  local_30._M_current =
       (connection_cleaner *)
       std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::
       cbegin((vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_> *)
              &iter);
  while( true ) {
    cleaner = (connection_cleaner *)
              std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
              ::cend((vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>
                      *)&iter);
    bVar1 = __gnu_cxx::
            operator==<const_lsignal::connection_cleaner_*,_std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>_>
                      (&local_30,
                       (__normal_iterator<const_lsignal::connection_cleaner_*,_std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>_>
                        *)&cleaner);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = (__shared_ptr_access<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_lsignal::connection_cleaner_*,_std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>_>
                 ::operator*(&local_30);
    peVar2 = std::
             __shared_ptr_access<lsignal::connection_data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    peVar2->deleted = true;
    __gnu_cxx::
    __normal_iterator<const_lsignal::connection_cleaner_*,_std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>_>
    ::operator++(&local_30);
  }
  std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::clear
            (&this->_cleaners);
  std::vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_>::~vector
            ((vector<lsignal::connection_cleaner,_std::allocator<lsignal::connection_cleaner>_> *)
             &iter);
  return;
}

Assistant:

void slot::disconnect()
	{
		decltype(_cleaners) cleaners = _cleaners;

		for (auto iter = cleaners.cbegin(); iter != cleaners.cend(); ++iter)
		{
			const connection_cleaner& cleaner = *iter;
			cleaner.data->deleted = true;
		}

		_cleaners.clear();
	}